

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

size_t HUF_writeCTable(void *dst,size_t maxDstSize,HUF_CElt *CTable,U32 maxSymbolValue,U32 huffLog)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  char cVar22;
  char cVar23;
  bool bVar24;
  uint uVar25;
  ulong uVar26;
  size_t sVar27;
  long lVar28;
  long lVar29;
  ulong wtSize;
  char *dst_00;
  undefined1 auVar30 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar50;
  int iVar53;
  int iVar54;
  undefined1 auVar51 [16];
  int iVar55;
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar69;
  int iVar73;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  BYTE bitsToWeight [13];
  BYTE huffWeight [255];
  char local_135 [269];
  
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  local_135[0] = '\0';
  uVar25 = huffLog + 1;
  if (1 < uVar25) {
    lVar28 = (ulong)uVar25 - 2;
    auVar30._8_4_ = (int)lVar28;
    auVar30._0_8_ = lVar28;
    auVar30._12_4_ = (int)((ulong)lVar28 >> 0x20);
    lVar28 = 0;
    lVar29 = 0;
    do {
      auVar48._8_4_ = (int)lVar29;
      auVar48._0_8_ = lVar29;
      auVar48._12_4_ = (int)((ulong)lVar29 >> 0x20);
      auVar51 = auVar30 ^ _DAT_0019daf0;
      auVar56 = (auVar48 | _DAT_0019f5f0) ^ _DAT_0019daf0;
      iVar50 = auVar51._0_4_;
      iVar69 = -(uint)(iVar50 < auVar56._0_4_);
      iVar53 = auVar51._4_4_;
      auVar58._4_4_ = -(uint)(iVar53 < auVar56._4_4_);
      iVar54 = auVar51._8_4_;
      iVar73 = -(uint)(iVar54 < auVar56._8_4_);
      iVar55 = auVar51._12_4_;
      auVar58._12_4_ = -(uint)(iVar55 < auVar56._12_4_);
      auVar31._4_4_ = iVar69;
      auVar31._0_4_ = iVar69;
      auVar31._8_4_ = iVar73;
      auVar31._12_4_ = iVar73;
      auVar31 = pshuflw(in_XMM1,auVar31,0xe8);
      auVar57._4_4_ = -(uint)(auVar56._4_4_ == iVar53);
      auVar57._12_4_ = -(uint)(auVar56._12_4_ == iVar55);
      auVar57._0_4_ = auVar57._4_4_;
      auVar57._8_4_ = auVar57._12_4_;
      auVar40 = pshuflw(in_XMM2,auVar57,0xe8);
      auVar58._0_4_ = auVar58._4_4_;
      auVar58._8_4_ = auVar58._12_4_;
      auVar56 = pshuflw(auVar31,auVar58,0xe8);
      auVar51._8_4_ = 0xffffffff;
      auVar51._0_8_ = 0xffffffffffffffff;
      auVar51._12_4_ = 0xffffffff;
      auVar51 = (auVar56 | auVar40 & auVar31) ^ auVar51;
      auVar51 = packssdw(auVar51,auVar51);
      cVar22 = (char)huffLog;
      cVar23 = (char)lVar28;
      if ((auVar51 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_135[lVar29 + 1] = cVar22 + cVar23;
      }
      auVar40._4_4_ = iVar69;
      auVar40._0_4_ = iVar69;
      auVar40._8_4_ = iVar73;
      auVar40._12_4_ = iVar73;
      auVar58 = auVar57 & auVar40 | auVar58;
      auVar51 = packssdw(auVar58,auVar58);
      auVar56._8_4_ = 0xffffffff;
      auVar56._0_8_ = 0xffffffffffffffff;
      auVar56._12_4_ = 0xffffffff;
      auVar51 = packssdw(auVar51 ^ auVar56,auVar51 ^ auVar56);
      auVar51 = packsswb(auVar51,auVar51);
      if ((auVar51._0_4_ >> 8 & 1) != 0) {
        local_135[lVar29 + 2] = cVar22 + cVar23 + -1;
      }
      auVar51 = (auVar48 | _DAT_0019f5e0) ^ _DAT_0019daf0;
      auVar41._0_4_ = -(uint)(iVar50 < auVar51._0_4_);
      auVar41._4_4_ = -(uint)(iVar53 < auVar51._4_4_);
      auVar41._8_4_ = -(uint)(iVar54 < auVar51._8_4_);
      auVar41._12_4_ = -(uint)(iVar55 < auVar51._12_4_);
      auVar59._4_4_ = auVar41._0_4_;
      auVar59._0_4_ = auVar41._0_4_;
      auVar59._8_4_ = auVar41._8_4_;
      auVar59._12_4_ = auVar41._8_4_;
      iVar69 = -(uint)(auVar51._4_4_ == iVar53);
      iVar73 = -(uint)(auVar51._12_4_ == iVar55);
      auVar10._4_4_ = iVar69;
      auVar10._0_4_ = iVar69;
      auVar10._8_4_ = iVar73;
      auVar10._12_4_ = iVar73;
      auVar70._4_4_ = auVar41._4_4_;
      auVar70._0_4_ = auVar41._4_4_;
      auVar70._8_4_ = auVar41._12_4_;
      auVar70._12_4_ = auVar41._12_4_;
      auVar51 = auVar10 & auVar59 | auVar70;
      auVar51 = packssdw(auVar51,auVar51);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar51 = packssdw(auVar51 ^ auVar1,auVar51 ^ auVar1);
      auVar51 = packsswb(auVar51,auVar51);
      if ((auVar51._0_4_ >> 0x10 & 1) != 0) {
        local_135[lVar29 + 3] = cVar22 + cVar23 + -2;
      }
      auVar51 = pshufhw(auVar51,auVar59,0x84);
      auVar11._4_4_ = iVar69;
      auVar11._0_4_ = iVar69;
      auVar11._8_4_ = iVar73;
      auVar11._12_4_ = iVar73;
      auVar56 = pshufhw(auVar41,auVar11,0x84);
      auVar31 = pshufhw(auVar51,auVar70,0x84);
      auVar32._8_4_ = 0xffffffff;
      auVar32._0_8_ = 0xffffffffffffffff;
      auVar32._12_4_ = 0xffffffff;
      auVar32 = (auVar31 | auVar56 & auVar51) ^ auVar32;
      auVar51 = packssdw(auVar32,auVar32);
      auVar51 = packsswb(auVar51,auVar51);
      if ((auVar51._0_4_ >> 0x18 & 1) != 0) {
        local_135[lVar29 + 4] = cVar22 + cVar23 + -3;
      }
      auVar51 = (auVar48 | _DAT_001a0090) ^ _DAT_0019daf0;
      auVar42._0_4_ = -(uint)(iVar50 < auVar51._0_4_);
      auVar42._4_4_ = -(uint)(iVar53 < auVar51._4_4_);
      auVar42._8_4_ = -(uint)(iVar54 < auVar51._8_4_);
      auVar42._12_4_ = -(uint)(iVar55 < auVar51._12_4_);
      auVar12._4_4_ = auVar42._0_4_;
      auVar12._0_4_ = auVar42._0_4_;
      auVar12._8_4_ = auVar42._8_4_;
      auVar12._12_4_ = auVar42._8_4_;
      auVar56 = pshuflw(auVar70,auVar12,0xe8);
      auVar33._0_4_ = -(uint)(auVar51._0_4_ == iVar50);
      auVar33._4_4_ = -(uint)(auVar51._4_4_ == iVar53);
      auVar33._8_4_ = -(uint)(auVar51._8_4_ == iVar54);
      auVar33._12_4_ = -(uint)(auVar51._12_4_ == iVar55);
      auVar60._4_4_ = auVar33._4_4_;
      auVar60._0_4_ = auVar33._4_4_;
      auVar60._8_4_ = auVar33._12_4_;
      auVar60._12_4_ = auVar33._12_4_;
      auVar51 = pshuflw(auVar33,auVar60,0xe8);
      auVar61._4_4_ = auVar42._4_4_;
      auVar61._0_4_ = auVar42._4_4_;
      auVar61._8_4_ = auVar42._12_4_;
      auVar61._12_4_ = auVar42._12_4_;
      auVar31 = pshuflw(auVar42,auVar61,0xe8);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar51 = packssdw(auVar51 & auVar56,(auVar31 | auVar51 & auVar56) ^ auVar2);
      auVar51 = packsswb(auVar51,auVar51);
      if ((auVar51 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_135[lVar29 + 5] = cVar22 + cVar23 + -4;
      }
      auVar13._4_4_ = auVar42._0_4_;
      auVar13._0_4_ = auVar42._0_4_;
      auVar13._8_4_ = auVar42._8_4_;
      auVar13._12_4_ = auVar42._8_4_;
      auVar61 = auVar60 & auVar13 | auVar61;
      auVar31 = packssdw(auVar61,auVar61);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar51 = packssdw(auVar51,auVar31 ^ auVar3);
      auVar51 = packsswb(auVar51,auVar51);
      if ((auVar51._4_2_ >> 8 & 1) != 0) {
        local_135[lVar29 + 6] = cVar22 + cVar23 + -5;
      }
      auVar51 = (auVar48 | _DAT_001a0080) ^ _DAT_0019daf0;
      auVar43._0_4_ = -(uint)(iVar50 < auVar51._0_4_);
      auVar43._4_4_ = -(uint)(iVar53 < auVar51._4_4_);
      auVar43._8_4_ = -(uint)(iVar54 < auVar51._8_4_);
      auVar43._12_4_ = -(uint)(iVar55 < auVar51._12_4_);
      auVar62._4_4_ = auVar43._0_4_;
      auVar62._0_4_ = auVar43._0_4_;
      auVar62._8_4_ = auVar43._8_4_;
      auVar62._12_4_ = auVar43._8_4_;
      iVar69 = -(uint)(auVar51._4_4_ == iVar53);
      iVar73 = -(uint)(auVar51._12_4_ == iVar55);
      auVar14._4_4_ = iVar69;
      auVar14._0_4_ = iVar69;
      auVar14._8_4_ = iVar73;
      auVar14._12_4_ = iVar73;
      auVar71._4_4_ = auVar43._4_4_;
      auVar71._0_4_ = auVar43._4_4_;
      auVar71._8_4_ = auVar43._12_4_;
      auVar71._12_4_ = auVar43._12_4_;
      auVar51 = auVar14 & auVar62 | auVar71;
      auVar51 = packssdw(auVar51,auVar51);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar51 = packssdw(auVar51 ^ auVar4,auVar51 ^ auVar4);
      auVar51 = packsswb(auVar51,auVar51);
      if ((auVar51 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_135[lVar29 + 7] = cVar22 + cVar23 + -6;
      }
      auVar51 = pshufhw(auVar51,auVar62,0x84);
      auVar15._4_4_ = iVar69;
      auVar15._0_4_ = iVar69;
      auVar15._8_4_ = iVar73;
      auVar15._12_4_ = iVar73;
      auVar56 = pshufhw(auVar43,auVar15,0x84);
      auVar31 = pshufhw(auVar51,auVar71,0x84);
      auVar34._8_4_ = 0xffffffff;
      auVar34._0_8_ = 0xffffffffffffffff;
      auVar34._12_4_ = 0xffffffff;
      auVar34 = (auVar31 | auVar56 & auVar51) ^ auVar34;
      auVar51 = packssdw(auVar34,auVar34);
      auVar51 = packsswb(auVar51,auVar51);
      if ((auVar51._6_2_ >> 8 & 1) != 0) {
        local_135[lVar29 + 8] = cVar22 + cVar23 + -7;
      }
      auVar51 = (auVar48 | _DAT_001a01b0) ^ _DAT_0019daf0;
      auVar44._0_4_ = -(uint)(iVar50 < auVar51._0_4_);
      auVar44._4_4_ = -(uint)(iVar53 < auVar51._4_4_);
      auVar44._8_4_ = -(uint)(iVar54 < auVar51._8_4_);
      auVar44._12_4_ = -(uint)(iVar55 < auVar51._12_4_);
      auVar16._4_4_ = auVar44._0_4_;
      auVar16._0_4_ = auVar44._0_4_;
      auVar16._8_4_ = auVar44._8_4_;
      auVar16._12_4_ = auVar44._8_4_;
      auVar56 = pshuflw(auVar71,auVar16,0xe8);
      auVar35._0_4_ = -(uint)(auVar51._0_4_ == iVar50);
      auVar35._4_4_ = -(uint)(auVar51._4_4_ == iVar53);
      auVar35._8_4_ = -(uint)(auVar51._8_4_ == iVar54);
      auVar35._12_4_ = -(uint)(auVar51._12_4_ == iVar55);
      auVar63._4_4_ = auVar35._4_4_;
      auVar63._0_4_ = auVar35._4_4_;
      auVar63._8_4_ = auVar35._12_4_;
      auVar63._12_4_ = auVar35._12_4_;
      auVar51 = pshuflw(auVar35,auVar63,0xe8);
      auVar64._4_4_ = auVar44._4_4_;
      auVar64._0_4_ = auVar44._4_4_;
      auVar64._8_4_ = auVar44._12_4_;
      auVar64._12_4_ = auVar44._12_4_;
      auVar31 = pshuflw(auVar44,auVar64,0xe8);
      auVar45._8_4_ = 0xffffffff;
      auVar45._0_8_ = 0xffffffffffffffff;
      auVar45._12_4_ = 0xffffffff;
      auVar45 = (auVar31 | auVar51 & auVar56) ^ auVar45;
      auVar31 = packssdw(auVar45,auVar45);
      auVar51 = packsswb(auVar51 & auVar56,auVar31);
      if ((auVar51 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_135[lVar29 + 9] = cVar22 + cVar23 + -8;
      }
      auVar17._4_4_ = auVar44._0_4_;
      auVar17._0_4_ = auVar44._0_4_;
      auVar17._8_4_ = auVar44._8_4_;
      auVar17._12_4_ = auVar44._8_4_;
      auVar64 = auVar63 & auVar17 | auVar64;
      auVar31 = packssdw(auVar64,auVar64);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar31 = packssdw(auVar31 ^ auVar5,auVar31 ^ auVar5);
      auVar51 = packsswb(auVar51,auVar31);
      if ((auVar51._8_2_ >> 8 & 1) != 0) {
        local_135[lVar29 + 10] = cVar22 + cVar23 + -9;
      }
      auVar51 = (auVar48 | _DAT_001a01a0) ^ _DAT_0019daf0;
      auVar46._0_4_ = -(uint)(iVar50 < auVar51._0_4_);
      auVar46._4_4_ = -(uint)(iVar53 < auVar51._4_4_);
      auVar46._8_4_ = -(uint)(iVar54 < auVar51._8_4_);
      auVar46._12_4_ = -(uint)(iVar55 < auVar51._12_4_);
      auVar65._4_4_ = auVar46._0_4_;
      auVar65._0_4_ = auVar46._0_4_;
      auVar65._8_4_ = auVar46._8_4_;
      auVar65._12_4_ = auVar46._8_4_;
      iVar69 = -(uint)(auVar51._4_4_ == iVar53);
      iVar73 = -(uint)(auVar51._12_4_ == iVar55);
      auVar18._4_4_ = iVar69;
      auVar18._0_4_ = iVar69;
      auVar18._8_4_ = iVar73;
      auVar18._12_4_ = iVar73;
      auVar72._4_4_ = auVar46._4_4_;
      auVar72._0_4_ = auVar46._4_4_;
      auVar72._8_4_ = auVar46._12_4_;
      auVar72._12_4_ = auVar46._12_4_;
      auVar51 = auVar18 & auVar65 | auVar72;
      auVar51 = packssdw(auVar51,auVar51);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar51 = packssdw(auVar51 ^ auVar6,auVar51 ^ auVar6);
      auVar51 = packsswb(auVar51,auVar51);
      if ((auVar51 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        local_135[lVar29 + 0xb] = cVar22 + cVar23 + -10;
      }
      auVar51 = pshufhw(auVar51,auVar65,0x84);
      auVar19._4_4_ = iVar69;
      auVar19._0_4_ = iVar69;
      auVar19._8_4_ = iVar73;
      auVar19._12_4_ = iVar73;
      auVar56 = pshufhw(auVar46,auVar19,0x84);
      auVar31 = pshufhw(auVar51,auVar72,0x84);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar31 | auVar56 & auVar51) ^ auVar36;
      auVar51 = packssdw(auVar36,auVar36);
      auVar51 = packsswb(auVar51,auVar51);
      if ((auVar51._10_2_ >> 8 & 1) != 0) {
        local_135[lVar29 + 0xc] = cVar22 + cVar23 + -0xb;
      }
      auVar51 = (auVar48 | _DAT_001a0190) ^ _DAT_0019daf0;
      auVar47._0_4_ = -(uint)(iVar50 < auVar51._0_4_);
      auVar47._4_4_ = -(uint)(iVar53 < auVar51._4_4_);
      auVar47._8_4_ = -(uint)(iVar54 < auVar51._8_4_);
      auVar47._12_4_ = -(uint)(iVar55 < auVar51._12_4_);
      auVar20._4_4_ = auVar47._0_4_;
      auVar20._0_4_ = auVar47._0_4_;
      auVar20._8_4_ = auVar47._8_4_;
      auVar20._12_4_ = auVar47._8_4_;
      auVar56 = pshuflw(auVar72,auVar20,0xe8);
      auVar37._0_4_ = -(uint)(auVar51._0_4_ == iVar50);
      auVar37._4_4_ = -(uint)(auVar51._4_4_ == iVar53);
      auVar37._8_4_ = -(uint)(auVar51._8_4_ == iVar54);
      auVar37._12_4_ = -(uint)(auVar51._12_4_ == iVar55);
      auVar66._4_4_ = auVar37._4_4_;
      auVar66._0_4_ = auVar37._4_4_;
      auVar66._8_4_ = auVar37._12_4_;
      auVar66._12_4_ = auVar37._12_4_;
      auVar51 = pshuflw(auVar37,auVar66,0xe8);
      auVar67._4_4_ = auVar47._4_4_;
      auVar67._0_4_ = auVar47._4_4_;
      auVar67._8_4_ = auVar47._12_4_;
      auVar67._12_4_ = auVar47._12_4_;
      auVar31 = pshuflw(auVar47,auVar67,0xe8);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar51 = packssdw(auVar51 & auVar56,(auVar31 | auVar51 & auVar56) ^ auVar7);
      auVar51 = packsswb(auVar51,auVar51);
      if ((auVar51 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_135[lVar29 + 0xd] = cVar22 + cVar23 + -0xc;
      }
      auVar21._4_4_ = auVar47._0_4_;
      auVar21._0_4_ = auVar47._0_4_;
      auVar21._8_4_ = auVar47._8_4_;
      auVar21._12_4_ = auVar47._8_4_;
      auVar67 = auVar66 & auVar21 | auVar67;
      auVar31 = packssdw(auVar67,auVar67);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar51 = packssdw(auVar51,auVar31 ^ auVar8);
      auVar51 = packsswb(auVar51,auVar51);
      if ((auVar51._12_2_ >> 8 & 1) != 0) {
        local_135[lVar29 + 0xe] = cVar22 + cVar23 + -0xd;
      }
      auVar51 = (auVar48 | _DAT_001a0180) ^ _DAT_0019daf0;
      auVar38._0_4_ = -(uint)(iVar50 < auVar51._0_4_);
      auVar38._4_4_ = -(uint)(iVar53 < auVar51._4_4_);
      auVar38._8_4_ = -(uint)(iVar54 < auVar51._8_4_);
      auVar38._12_4_ = -(uint)(iVar55 < auVar51._12_4_);
      auVar68._4_4_ = auVar38._0_4_;
      auVar68._0_4_ = auVar38._0_4_;
      auVar68._8_4_ = auVar38._8_4_;
      auVar68._12_4_ = auVar38._8_4_;
      auVar49._4_4_ = -(uint)(auVar51._4_4_ == iVar53);
      auVar49._12_4_ = -(uint)(auVar51._12_4_ == iVar55);
      auVar49._0_4_ = auVar49._4_4_;
      auVar49._8_4_ = auVar49._12_4_;
      auVar52._4_4_ = auVar38._4_4_;
      auVar52._0_4_ = auVar38._4_4_;
      auVar52._8_4_ = auVar38._12_4_;
      auVar52._12_4_ = auVar38._12_4_;
      auVar31 = auVar49 & auVar68 | auVar52;
      auVar51 = packssdw(auVar38,auVar31);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar51 = packssdw(auVar51 ^ auVar9,auVar51 ^ auVar9);
      auVar51 = packsswb(auVar51,auVar51);
      if ((auVar51 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_135[lVar29 + 0xf] = cVar22 + cVar23 + -0xe;
      }
      auVar51 = pshufhw(auVar51,auVar68,0x84);
      auVar31 = pshufhw(auVar31,auVar49,0x84);
      in_XMM2 = auVar31 & auVar51;
      auVar51 = pshufhw(auVar51,auVar52,0x84);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar39 = (auVar51 | in_XMM2) ^ auVar39;
      auVar51 = packssdw(auVar39,auVar39);
      in_XMM1 = packsswb(auVar51,auVar51);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        local_135[lVar29 + 0x10] = cVar22 + cVar23 + -0xf;
      }
      lVar29 = lVar29 + 0x10;
      lVar28 = lVar28 + -0x10;
    } while (-lVar28 != ((ulong)uVar25 + 0xe & 0xfffffffffffffff0));
  }
  wtSize = (ulong)maxSymbolValue;
  if (maxSymbolValue != 0) {
    uVar26 = 0;
    do {
      local_135[uVar26 + 0xd] = local_135[CTable[uVar26].nbBits];
      uVar26 = uVar26 + 1;
    } while (wtSize != uVar26);
  }
  dst_00 = (char *)((long)dst + 1);
  sVar27 = HUF_compressWeights(dst_00,maxDstSize - 1,local_135 + 0xd,wtSize);
  if (sVar27 < 0xffffffffffffff89) {
    if (maxSymbolValue >> 1 <= sVar27 || sVar27 < 2) {
      bVar24 = true;
      goto LAB_0018779a;
    }
    *(char *)dst = (char)sVar27;
    sVar27 = sVar27 + 1;
  }
  bVar24 = false;
LAB_0018779a:
  if ((bVar24) && (sVar27 = 0xffffffffffffffff, maxSymbolValue < 0x81)) {
    uVar26 = (ulong)((maxSymbolValue + 1 >> 1) + 1);
    sVar27 = 0xffffffffffffffba;
    if (uVar26 <= maxDstSize) {
      *(char *)dst = (char)maxSymbolValue + '\x7f';
      local_135[wtSize + 0xd] = '\0';
      sVar27 = uVar26;
      if (maxSymbolValue != 0) {
        uVar26 = 0;
        do {
          *dst_00 = local_135[uVar26 + 0xd] * '\x10' + local_135[uVar26 + 0xe];
          uVar26 = uVar26 + 2;
          dst_00 = dst_00 + 1;
        } while (uVar26 < wtSize);
      }
    }
  }
  return sVar27;
}

Assistant:

size_t HUF_writeCTable (void* dst, size_t maxDstSize,
                        const HUF_CElt* CTable, U32 maxSymbolValue, U32 huffLog)
{
    BYTE bitsToWeight[HUF_TABLELOG_MAX + 1];   /* precomputed conversion table */
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX];
    BYTE* op = (BYTE*)dst;
    U32 n;

     /* check conditions */
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        huffWeight[n] = bitsToWeight[CTable[n].nbBits];

    /* attempt weights compression by FSE */
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, huffWeight, maxSymbolValue) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((huffWeight[n] << 4) + huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}